

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  ImGuiContext *ctx;
  ImGuiContext *in_RDI;
  int i;
  ImGuiContext *backup_context;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  ImGuiContext *ini_filename;
  
  ini_filename = in_RDI;
  if (((in_RDI->IO).Fonts != (ImFontAtlas *)0x0) && ((in_RDI->FontAtlasOwnedByContext & 1U) != 0)) {
    ((in_RDI->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((ImFontAtlas *)0x1d401d);
  }
  (ini_filename->IO).Fonts = (ImFontAtlas *)0x0;
  ctx = GImGui;
  if ((ini_filename->Initialized & 1U) != 0) {
    if (((ini_filename->SettingsLoaded & 1U) != 0) &&
       ((ini_filename->IO).IniFilename != (char *)0x0)) {
      SetCurrentContext(in_RDI);
      SaveIniSettingsToDisk(&ini_filename->Initialized);
      SetCurrentContext(ctx);
    }
    for (iVar1 = 0; iVar1 < (ini_filename->Windows).Size; iVar1 = iVar1 + 1) {
      ImVector<ImGuiWindow_*>::operator[]
                ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IM_DELETE<ImGuiWindow>((ImGuiWindow *)0x1d40ba);
    }
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ini_filename->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImGuiStorage::Clear((ImGuiStorage *)0x1d412c);
    ini_filename->NavWindow = (ImGuiWindow *)0x0;
    ini_filename->HoveredRootWindow = (ImGuiWindow *)0x0;
    ini_filename->HoveredWindow = (ImGuiWindow *)0x0;
    ini_filename->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    ini_filename->ActiveIdWindow = (ImGuiWindow *)0x0;
    ini_filename->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear
              ((ImVector<ImGuiColorMod> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiStyleMod>::clear
              ((ImVector<ImGuiStyleMod> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPopupData>::clear
              ((ImVector<ImGuiPopupData> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPopupData>::clear
              ((ImVector<ImGuiPopupData> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImDrawDataBuilder::ClearFreeMemory
              ((ImDrawDataBuilder *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImDrawList::ClearFreeMemory((ImDrawList *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImDrawList::ClearFreeMemory((ImDrawList *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImPool<ImGuiTabBar>::Clear((ImPool<ImGuiTabBar> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPtrOrIndex>::clear
              ((ImVector<ImGuiPtrOrIndex> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<ImGuiShrinkWidthItem>::clear
              ((ImVector<ImGuiShrinkWidthItem> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<char>::clear((ImVector<char> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImVector<unsigned_int>::clear
              ((ImVector<unsigned_int> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImGuiInputTextState::ClearFreeMemory
              ((ImGuiInputTextState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x1d428b);
    ImVector<ImGuiSettingsHandler>::clear
              ((ImVector<ImGuiSettingsHandler> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    if (ini_filename->LogFile != (ImFileHandle)0x0) {
      if (ini_filename->LogFile != _stdout) {
        ImFileClose((ImFileHandle)0x1d42d4);
      }
      ini_filename->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1d42f5);
    ini_filename->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(context);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();
    g.DrawDataBuilder.ClearFreeMemory();
    g.BackgroundDrawList.ClearFreeMemory();
    g.ForegroundDrawList.ClearFreeMemory();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}